

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

void save_open_settings(settings_w *sesskey,Conf *conf)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  Filename *pFVar7;
  FontSpec *pFVar8;
  size_t sVar9;
  ulong uVar10;
  char buf [20];
  char buf2 [30];
  ulong local_168;
  char local_158 [32];
  char local_138 [264];
  
  write_setting_i(sesskey,"Present",1);
  pcVar6 = conf_get_str(conf,0);
  write_setting_s(sesskey,"HostName",pcVar6);
  pFVar7 = conf_get_filename(conf,0x81);
  write_setting_filename(sesskey,"LogFileName",pFVar7);
  iVar2 = conf_get_int(conf,0x82);
  write_setting_i(sesskey,"LogType",iVar2);
  iVar2 = conf_get_int(conf,0x83);
  write_setting_i(sesskey,"LogFileClash",iVar2);
  _Var1 = conf_get_bool(conf,0x84);
  write_setting_i(sesskey,"LogFlush",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x85);
  write_setting_i(sesskey,"LogHeader",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x86);
  write_setting_i(sesskey,"SSHLogOmitPasswords",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x87);
  write_setting_i(sesskey,"SSHLogOmitData",(uint)_Var1);
  conf_get_int(conf,2);
  write_setting_s(sesskey,"Protocol","raw");
  iVar2 = conf_get_int(conf,1);
  write_setting_i(sesskey,"PortNumber",iVar2);
  iVar2 = conf_get_int(conf,4);
  write_setting_i(sesskey,"CloseOnExit",iVar2 + ((iVar2 + 2) / 3) * -3 + 2);
  _Var1 = conf_get_bool(conf,5);
  write_setting_i(sesskey,"WarnOnClose",(uint)_Var1);
  iVar2 = conf_get_int(conf,6);
  write_setting_i(sesskey,"PingInterval",iVar2 / 0x3c);
  iVar2 = conf_get_int(conf,6);
  write_setting_i(sesskey,"PingIntervalSecs",iVar2 % 0x3c);
  _Var1 = conf_get_bool(conf,7);
  write_setting_i(sesskey,"TCPNoDelay",(uint)_Var1);
  _Var1 = conf_get_bool(conf,8);
  write_setting_i(sesskey,"TCPKeepalives",(uint)_Var1);
  pcVar6 = conf_get_str(conf,0x35);
  write_setting_s(sesskey,"TerminalType",pcVar6);
  pcVar6 = conf_get_str(conf,0x36);
  write_setting_s(sesskey,"TerminalSpeed",pcVar6);
  wmap(sesskey,"TerminalModes",conf,0x37,true);
  iVar2 = conf_get_int(conf,3);
  write_setting_i(sesskey,"AddressFamily",iVar2);
  pcVar6 = conf_get_str(conf,10);
  write_setting_s(sesskey,"ProxyExcludeList",pcVar6);
  iVar2 = conf_get_int(conf,0xb);
  write_setting_i(sesskey,"ProxyDNS",iVar2 + ((iVar2 + 2) / 3) * -3 + 2);
  _Var1 = conf_get_bool(conf,0xc);
  write_setting_i(sesskey,"ProxyLocalhost",(uint)_Var1);
  iVar2 = conf_get_int(conf,0xd);
  write_setting_i(sesskey,"ProxyMethod",iVar2);
  pcVar6 = conf_get_str(conf,0xe);
  write_setting_s(sesskey,"ProxyHost",pcVar6);
  iVar2 = conf_get_int(conf,0xf);
  write_setting_i(sesskey,"ProxyPort",iVar2);
  pcVar6 = conf_get_str(conf,0x10);
  write_setting_s(sesskey,"ProxyUsername",pcVar6);
  pcVar6 = conf_get_str(conf,0x11);
  write_setting_s(sesskey,"ProxyPassword",pcVar6);
  pcVar6 = conf_get_str(conf,0x12);
  write_setting_s(sesskey,"ProxyTelnetCommand",pcVar6);
  iVar2 = conf_get_int(conf,0x13);
  write_setting_i(sesskey,"ProxyLogToTerm",iVar2);
  wmap(sesskey,"Environment",conf,0x38,true);
  pcVar6 = conf_get_str(conf,0x39);
  write_setting_s(sesskey,"UserName",pcVar6);
  _Var1 = conf_get_bool(conf,0x3a);
  write_setting_i(sesskey,"UserNameFromEnvironment",(uint)_Var1);
  pcVar6 = conf_get_str(conf,0x3b);
  write_setting_s(sesskey,"LocalUserName",pcVar6);
  _Var1 = conf_get_bool(conf,0x16);
  write_setting_i(sesskey,"NoPTY",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x17);
  write_setting_i(sesskey,"Compression",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x1d);
  write_setting_i(sesskey,"TryAgent",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x1e);
  write_setting_i(sesskey,"AgentFwd",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x2c);
  write_setting_i(sesskey,"GssapiFwd",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x1f);
  write_setting_i(sesskey,"ChangeUsername",(uint)_Var1);
  wprefs(sesskey,"Cipher",ciphernames,7,conf,0x20);
  wprefs(sesskey,"KEX",kexnames,7,conf,0x18);
  wprefs(sesskey,"HostKey",hknames,6,conf,0x19);
  _Var1 = conf_get_bool(conf,0x1a);
  write_setting_i(sesskey,"PreferKnownHostKeys",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x1b);
  write_setting_i(sesskey,"RekeyTime",iVar2);
  iVar2 = conf_get_int(conf,0x2d);
  write_setting_i(sesskey,"GssapiRekey",iVar2);
  pcVar6 = conf_get_str(conf,0x1c);
  write_setting_s(sesskey,"RekeyBytes",pcVar6);
  _Var1 = conf_get_bool(conf,0x25);
  write_setting_i(sesskey,"SshNoAuth",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x26);
  write_setting_i(sesskey,"SshNoTrivialAuth",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x27);
  write_setting_i(sesskey,"SshBanner",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x28);
  write_setting_i(sesskey,"AuthTIS",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x29);
  write_setting_i(sesskey,"AuthKI",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x2a);
  write_setting_i(sesskey,"AuthGSSAPI",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x2b);
  write_setting_i(sesskey,"AuthGSSAPIKEX",(uint)_Var1);
  wprefs(sesskey,"GSSLibs",(keyvalwhere *)"%s packet ",0,conf,0x2e);
  pFVar7 = conf_get_filename(conf,0x2f);
  write_setting_filename(sesskey,"GSSCustom",pFVar7);
  _Var1 = conf_get_bool(conf,0x32);
  write_setting_i(sesskey,"SshNoShell",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x23);
  write_setting_i(sesskey,"SshProt",iVar2);
  pcVar6 = conf_get_str(conf,9);
  write_setting_s(sesskey,"LogHost",pcVar6);
  _Var1 = conf_get_bool(conf,0x24);
  write_setting_i(sesskey,"SSH2DES",(uint)_Var1);
  pFVar7 = conf_get_filename(conf,0x21);
  write_setting_filename(sesskey,"PublicKeyFile",pFVar7);
  pFVar7 = conf_get_filename(conf,0x22);
  write_setting_filename(sesskey,"DetachedCertificate",pFVar7);
  pcVar6 = conf_get_str(conf,0x14);
  write_setting_s(sesskey,"RemoteCommand",pcVar6);
  _Var1 = conf_get_bool(conf,0x3c);
  write_setting_i(sesskey,"RFCEnviron",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x3d);
  write_setting_i(sesskey,"PassiveTelnet",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x48);
  write_setting_i(sesskey,"BackspaceIsDelete",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x49);
  write_setting_i(sesskey,"RXVTHomeEnd",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x4a);
  write_setting_i(sesskey,"LinuxFunctionKeys",iVar2);
  iVar2 = conf_get_int(conf,0x4b);
  write_setting_i(sesskey,"ShiftedArrowKeys",iVar2);
  _Var1 = conf_get_bool(conf,0x4d);
  write_setting_i(sesskey,"NoApplicationKeys",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x4c);
  write_setting_i(sesskey,"NoApplicationCursors",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x4e);
  write_setting_i(sesskey,"NoMouseReporting",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x4f);
  write_setting_i(sesskey,"NoRemoteResize",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x50);
  write_setting_i(sesskey,"NoAltScreen",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x51);
  write_setting_i(sesskey,"NoRemoteWinTitle",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x52);
  write_setting_i(sesskey,"NoRemoteClearScroll",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x55);
  write_setting_i(sesskey,"RemoteQTitleAction",iVar2);
  _Var1 = conf_get_bool(conf,0x53);
  write_setting_i(sesskey,"NoDBackspace",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x54);
  write_setting_i(sesskey,"NoRemoteCharset",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x56);
  write_setting_i(sesskey,"ApplicationCursorKeys",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x57);
  write_setting_i(sesskey,"ApplicationKeypad",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x58);
  write_setting_i(sesskey,"NetHackKeypad",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x5b);
  write_setting_i(sesskey,"AltF4",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x5c);
  write_setting_i(sesskey,"AltSpace",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x5d);
  write_setting_i(sesskey,"AltOnly",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x65);
  write_setting_i(sesskey,"ComposeKey",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x66);
  write_setting_i(sesskey,"CtrlAltKeys",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x59);
  write_setting_i(sesskey,"TelnetKey",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x5a);
  write_setting_i(sesskey,"TelnetRet",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x5e);
  write_setting_i(sesskey,"LocalEcho",iVar2);
  iVar2 = conf_get_int(conf,0x5f);
  write_setting_i(sesskey,"LocalEdit",iVar2);
  pcVar6 = conf_get_str(conf,0x8b);
  write_setting_s(sesskey,"Answerback",pcVar6);
  _Var1 = conf_get_bool(conf,0x60);
  write_setting_i(sesskey,"AlwaysOnTop",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x61);
  write_setting_i(sesskey,"FullScreenOnAltEnter",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x88);
  write_setting_i(sesskey,"HideMousePtr",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x89);
  write_setting_i(sesskey,"SunkenEdge",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x8a);
  write_setting_i(sesskey,"WindowBorder",iVar2);
  iVar2 = conf_get_int(conf,0x6e);
  write_setting_i(sesskey,"CurType",iVar2);
  _Var1 = conf_get_bool(conf,0x6f);
  write_setting_i(sesskey,"BlinkCur",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x70);
  write_setting_i(sesskey,"Beep",iVar2);
  iVar2 = conf_get_int(conf,0x71);
  write_setting_i(sesskey,"BeepInd",iVar2);
  pFVar7 = conf_get_filename(conf,0x76);
  write_setting_filename(sesskey,"BellWaveFile",pFVar7);
  _Var1 = conf_get_bool(conf,0x72);
  write_setting_i(sesskey,"BellOverload",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x73);
  write_setting_i(sesskey,"BellOverloadN",iVar2);
  iVar2 = conf_get_int(conf,0x74);
  write_setting_i(sesskey,"BellOverloadT",iVar2);
  iVar2 = conf_get_int(conf,0x75);
  write_setting_i(sesskey,"BellOverloadS",iVar2);
  iVar2 = conf_get_int(conf,0x6a);
  write_setting_i(sesskey,"ScrollbackLines",iVar2);
  _Var1 = conf_get_bool(conf,0x6b);
  write_setting_i(sesskey,"DECOriginMode",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x6c);
  write_setting_i(sesskey,"AutoWrapMode",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x6d);
  write_setting_i(sesskey,"LFImpliesCR",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xcc);
  write_setting_i(sesskey,"CRImpliesLF",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x8d);
  write_setting_i(sesskey,"DisableArabicShaping",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x8e);
  write_setting_i(sesskey,"DisableBidi",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x7c);
  write_setting_i(sesskey,"WinNameAlways",(uint)_Var1);
  pcVar6 = conf_get_str(conf,0x69);
  write_setting_s(sesskey,"WinTitle",pcVar6);
  iVar2 = conf_get_int(conf,0x7d);
  write_setting_i(sesskey,"TermWidth",iVar2);
  iVar2 = conf_get_int(conf,0x7e);
  write_setting_i(sesskey,"TermHeight",iVar2);
  pFVar8 = conf_get_fontspec(conf,0x7f);
  write_setting_fontspec(sesskey,"Font",pFVar8);
  iVar2 = conf_get_int(conf,0x80);
  write_setting_i(sesskey,"FontQuality",iVar2);
  iVar2 = conf_get_int(conf,0xa5);
  write_setting_i(sesskey,"FontVTMode",iVar2);
  _Var1 = conf_get_bool(conf,0x92);
  write_setting_i(sesskey,"UseSystemColours",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x93);
  write_setting_i(sesskey,"TryPalette",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x8f);
  write_setting_i(sesskey,"ANSIColour",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x90);
  write_setting_i(sesskey,"Xterm256Colour",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x91);
  write_setting_i(sesskey,"TrueColour",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x94);
  write_setting_i(sesskey,"BoldAsColour",iVar2 + -1);
  iVar2 = 0;
  uVar10 = 0;
  do {
    sprintf(local_158,"Colour%d",uVar10);
    uVar3 = conf_get_int_int(conf,0x95,iVar2);
    uVar4 = conf_get_int_int(conf,0x95,iVar2 + 1);
    uVar5 = conf_get_int_int(conf,0x95,iVar2 + 2);
    sprintf(local_138,"%d,%d,%d",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
    write_setting_s(sesskey,local_158,local_138);
    uVar3 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar3;
    iVar2 = iVar2 + 3;
  } while (uVar3 != 0x16);
  _Var1 = conf_get_bool(conf,0x99);
  write_setting_i(sesskey,"RawCNP",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x9a);
  write_setting_i(sesskey,"UTF8linedraw",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x9b);
  write_setting_i(sesskey,"PasteRTF",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x96);
  write_setting_i(sesskey,"MouseIsXterm",iVar2);
  _Var1 = conf_get_bool(conf,0x97);
  write_setting_i(sesskey,"RectSelect",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x98);
  write_setting_i(sesskey,"PasteControls",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x9c);
  write_setting_i(sesskey,"MouseOverride",(uint)_Var1);
  local_168 = 0;
  do {
    sprintf(local_158,"Wordness%d",local_168);
    local_138[0] = '\0';
    iVar2 = 0;
    do {
      uVar3 = (uint)local_168;
      sVar9 = strlen(local_138);
      pcVar6 = ",";
      if (local_138[0] == '\0') {
        pcVar6 = "";
      }
      uVar4 = conf_get_int_int(conf,0x9d,uVar3 + iVar2);
      sprintf(local_138 + sVar9,"%s%d",pcVar6,(ulong)uVar4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x20);
    write_setting_s(sesskey,local_158,local_138);
    local_168 = (ulong)(uVar3 + 0x20);
  } while (uVar3 < 0xe0);
  _Var1 = conf_get_bool(conf,0x9e);
  write_setting_i(sesskey,"MouseAutocopy",(uint)_Var1);
  write_clip_setting(sesskey,"MousePaste",conf,0x9f,0xa2);
  write_clip_setting(sesskey,"CtrlShiftIns",conf,0xa0,0xa3);
  write_clip_setting(sesskey,"CtrlShiftCV",conf,0xa1,0xa4);
  pcVar6 = conf_get_str(conf,0xa6);
  write_setting_s(sesskey,"LineCodePage",pcVar6);
  _Var1 = conf_get_bool(conf,0xa7);
  write_setting_i(sesskey,"CJKAmbigWide",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xa8);
  write_setting_i(sesskey,"UTF8Override",(uint)_Var1);
  pcVar6 = conf_get_str(conf,0x8c);
  write_setting_s(sesskey,"Printer",pcVar6);
  _Var1 = conf_get_bool(conf,0xa9);
  write_setting_i(sesskey,"CapsLockCyr",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x77);
  write_setting_i(sesskey,"ScrollBar",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x78);
  write_setting_i(sesskey,"ScrollBarFullScreen",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x62);
  write_setting_i(sesskey,"ScrollOnKey",(uint)_Var1);
  _Var1 = conf_get_bool(conf,99);
  write_setting_i(sesskey,"ScrollOnDisp",(uint)_Var1);
  _Var1 = conf_get_bool(conf,100);
  write_setting_i(sesskey,"EraseToScrollback",(uint)_Var1);
  iVar2 = conf_get_int(conf,0x79);
  write_setting_i(sesskey,"LockSize",iVar2);
  _Var1 = conf_get_bool(conf,0x7a);
  write_setting_i(sesskey,"BCE",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x7b);
  write_setting_i(sesskey,"BlinkText",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xaa);
  write_setting_i(sesskey,"X11Forward",(uint)_Var1);
  pcVar6 = conf_get_str(conf,0xab);
  write_setting_s(sesskey,"X11Display",pcVar6);
  iVar2 = conf_get_int(conf,0xac);
  write_setting_i(sesskey,"X11AuthType",iVar2);
  pFVar7 = conf_get_filename(conf,0xad);
  write_setting_filename(sesskey,"X11AuthFile",pFVar7);
  _Var1 = conf_get_bool(conf,0xae);
  write_setting_i(sesskey,"LocalPortAcceptAll",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xaf);
  write_setting_i(sesskey,"RemotePortAcceptAll",(uint)_Var1);
  wmap(sesskey,"PortForwardings",conf,0xb0,true);
  iVar2 = conf_get_int(conf,0xb1);
  write_setting_i(sesskey,"BugIgnore1",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb2);
  write_setting_i(sesskey,"BugPlainPW1",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb3);
  write_setting_i(sesskey,"BugRSA1",2 - iVar2);
  iVar2 = conf_get_int(conf,0xba);
  write_setting_i(sesskey,"BugIgnore2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb4);
  write_setting_i(sesskey,"BugHMAC2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb5);
  write_setting_i(sesskey,"BugDeriveKey2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb6);
  write_setting_i(sesskey,"BugRSAPad2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb7);
  write_setting_i(sesskey,"BugPKSessID2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb8);
  write_setting_i(sesskey,"BugRekey2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xb9);
  write_setting_i(sesskey,"BugMaxPkt2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xbb);
  write_setting_i(sesskey,"BugOldGex2",2 - iVar2);
  iVar2 = conf_get_int(conf,0xbc);
  write_setting_i(sesskey,"BugWinadj",2 - iVar2);
  iVar2 = conf_get_int(conf,0xbd);
  write_setting_i(sesskey,"BugChanReq",2 - iVar2);
  iVar2 = conf_get_int(conf,0xbe);
  write_setting_i(sesskey,"BugDropStart",2 - iVar2);
  _Var1 = conf_get_bool(conf,0xc4);
  write_setting_i(sesskey,"StampUtmp",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xc5);
  write_setting_i(sesskey,"LoginShell",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xc6);
  write_setting_i(sesskey,"ScrollbarOnLeft",(uint)_Var1);
  pFVar8 = conf_get_fontspec(conf,200);
  write_setting_fontspec(sesskey,"BoldFont",pFVar8);
  pFVar8 = conf_get_fontspec(conf,0xc9);
  write_setting_fontspec(sesskey,"WideFont",pFVar8);
  pFVar8 = conf_get_fontspec(conf,0xca);
  write_setting_fontspec(sesskey,"WideBoldFont",pFVar8);
  _Var1 = conf_get_bool(conf,199);
  write_setting_i(sesskey,"ShadowBold",(uint)_Var1);
  iVar2 = conf_get_int(conf,0xcb);
  write_setting_i(sesskey,"ShadowBoldOffset",iVar2);
  pcVar6 = conf_get_str(conf,0x3e);
  write_setting_s(sesskey,"SerialLine",pcVar6);
  iVar2 = conf_get_int(conf,0x3f);
  write_setting_i(sesskey,"SerialSpeed",iVar2);
  iVar2 = conf_get_int(conf,0x40);
  write_setting_i(sesskey,"SerialDataBits",iVar2);
  iVar2 = conf_get_int(conf,0x41);
  write_setting_i(sesskey,"SerialStopHalfbits",iVar2);
  iVar2 = conf_get_int(conf,0x42);
  write_setting_i(sesskey,"SerialParity",iVar2);
  iVar2 = conf_get_int(conf,0x43);
  write_setting_i(sesskey,"SerialFlowControl",iVar2);
  pcVar6 = conf_get_str(conf,0xcd);
  write_setting_s(sesskey,"WindowClass",pcVar6);
  _Var1 = conf_get_bool(conf,0xc0);
  write_setting_i(sesskey,"ConnectionSharing",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xc1);
  write_setting_i(sesskey,"ConnectionSharingUpstream",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0xc2);
  write_setting_i(sesskey,"ConnectionSharingDownstream",(uint)_Var1);
  wmap(sesskey,"SSHManualHostKeys",conf,0xc3,false);
  pcVar6 = conf_get_str(conf,0x44);
  write_setting_s(sesskey,"SUPDUPLocation",pcVar6);
  iVar2 = conf_get_int(conf,0x45);
  write_setting_i(sesskey,"SUPDUPCharset",iVar2);
  _Var1 = conf_get_bool(conf,0x46);
  write_setting_i(sesskey,"SUPDUPMoreProcessing",(uint)_Var1);
  _Var1 = conf_get_bool(conf,0x47);
  write_setting_i(sesskey,"SUPDUPScrolling",(uint)_Var1);
  return;
}

Assistant:

void save_open_settings(settings_w *sesskey, Conf *conf)
{
    int i;
    const char *p;

    write_setting_i(sesskey, "Present", 1);
    write_setting_s(sesskey, "HostName", conf_get_str(conf, CONF_host));
    write_setting_filename(sesskey, "LogFileName", conf_get_filename(conf, CONF_logfilename));
    write_setting_i(sesskey, "LogType", conf_get_int(conf, CONF_logtype));
    write_setting_i(sesskey, "LogFileClash", conf_get_int(conf, CONF_logxfovr));
    write_setting_b(sesskey, "LogFlush", conf_get_bool(conf, CONF_logflush));
    write_setting_b(sesskey, "LogHeader", conf_get_bool(conf, CONF_logheader));
    write_setting_b(sesskey, "SSHLogOmitPasswords", conf_get_bool(conf, CONF_logomitpass));
    write_setting_b(sesskey, "SSHLogOmitData", conf_get_bool(conf, CONF_logomitdata));
    p = "raw";
    {
        const struct BackendVtable *vt =
            backend_vt_from_proto(conf_get_int(conf, CONF_protocol));
        if (vt)
            p = vt->id;
    }
    write_setting_s(sesskey, "Protocol", p);
    write_setting_i(sesskey, "PortNumber", conf_get_int(conf, CONF_port));
    /* The CloseOnExit numbers are arranged in a different order from
     * the standard FORCE_ON / FORCE_OFF / AUTO. */
    write_setting_i(sesskey, "CloseOnExit", (conf_get_int(conf, CONF_close_on_exit)+2)%3);
    write_setting_b(sesskey, "WarnOnClose", !!conf_get_bool(conf, CONF_warn_on_close));
    write_setting_i(sesskey, "PingInterval", conf_get_int(conf, CONF_ping_interval) / 60);      /* minutes */
    write_setting_i(sesskey, "PingIntervalSecs", conf_get_int(conf, CONF_ping_interval) % 60);  /* seconds */
    write_setting_b(sesskey, "TCPNoDelay", conf_get_bool(conf, CONF_tcp_nodelay));
    write_setting_b(sesskey, "TCPKeepalives", conf_get_bool(conf, CONF_tcp_keepalives));
    write_setting_s(sesskey, "TerminalType", conf_get_str(conf, CONF_termtype));
    write_setting_s(sesskey, "TerminalSpeed", conf_get_str(conf, CONF_termspeed));
    wmap(sesskey, "TerminalModes", conf, CONF_ttymodes, true);

    /* Address family selection */
    write_setting_i(sesskey, "AddressFamily", conf_get_int(conf, CONF_addressfamily));

    /* proxy settings */
    write_setting_s(sesskey, "ProxyExcludeList", conf_get_str(conf, CONF_proxy_exclude_list));
    write_setting_i(sesskey, "ProxyDNS", (conf_get_int(conf, CONF_proxy_dns)+2)%3);
    write_setting_b(sesskey, "ProxyLocalhost", conf_get_bool(conf, CONF_even_proxy_localhost));
    write_setting_i(sesskey, "ProxyMethod", conf_get_int(conf, CONF_proxy_type));
    write_setting_s(sesskey, "ProxyHost", conf_get_str(conf, CONF_proxy_host));
    write_setting_i(sesskey, "ProxyPort", conf_get_int(conf, CONF_proxy_port));
    write_setting_s(sesskey, "ProxyUsername", conf_get_str(conf, CONF_proxy_username));
    write_setting_s(sesskey, "ProxyPassword", conf_get_str(conf, CONF_proxy_password));
    write_setting_s(sesskey, "ProxyTelnetCommand", conf_get_str(conf, CONF_proxy_telnet_command));
    write_setting_i(sesskey, "ProxyLogToTerm", conf_get_int(conf, CONF_proxy_log_to_term));
    wmap(sesskey, "Environment", conf, CONF_environmt, true);
    write_setting_s(sesskey, "UserName", conf_get_str(conf, CONF_username));
    write_setting_b(sesskey, "UserNameFromEnvironment", conf_get_bool(conf, CONF_username_from_env));
    write_setting_s(sesskey, "LocalUserName", conf_get_str(conf, CONF_localusername));
    write_setting_b(sesskey, "NoPTY", conf_get_bool(conf, CONF_nopty));
    write_setting_b(sesskey, "Compression", conf_get_bool(conf, CONF_compression));
    write_setting_b(sesskey, "TryAgent", conf_get_bool(conf, CONF_tryagent));
    write_setting_b(sesskey, "AgentFwd", conf_get_bool(conf, CONF_agentfwd));
#ifndef NO_GSSAPI
    write_setting_b(sesskey, "GssapiFwd", conf_get_bool(conf, CONF_gssapifwd));
#endif
    write_setting_b(sesskey, "ChangeUsername", conf_get_bool(conf, CONF_change_username));
    wprefs(sesskey, "Cipher", ciphernames, CIPHER_MAX, conf, CONF_ssh_cipherlist);
    wprefs(sesskey, "KEX", kexnames, KEX_MAX, conf, CONF_ssh_kexlist);
    wprefs(sesskey, "HostKey", hknames, HK_MAX, conf, CONF_ssh_hklist);
    write_setting_b(sesskey, "PreferKnownHostKeys", conf_get_bool(conf, CONF_ssh_prefer_known_hostkeys));
    write_setting_i(sesskey, "RekeyTime", conf_get_int(conf, CONF_ssh_rekey_time));
#ifndef NO_GSSAPI
    write_setting_i(sesskey, "GssapiRekey", conf_get_int(conf, CONF_gssapirekey));
#endif
    write_setting_s(sesskey, "RekeyBytes", conf_get_str(conf, CONF_ssh_rekey_data));
    write_setting_b(sesskey, "SshNoAuth", conf_get_bool(conf, CONF_ssh_no_userauth));
    write_setting_b(sesskey, "SshNoTrivialAuth", conf_get_bool(conf, CONF_ssh_no_trivial_userauth));
    write_setting_b(sesskey, "SshBanner", conf_get_bool(conf, CONF_ssh_show_banner));
    write_setting_b(sesskey, "AuthTIS", conf_get_bool(conf, CONF_try_tis_auth));
    write_setting_b(sesskey, "AuthKI", conf_get_bool(conf, CONF_try_ki_auth));
#ifndef NO_GSSAPI
    write_setting_b(sesskey, "AuthGSSAPI", conf_get_bool(conf, CONF_try_gssapi_auth));
    write_setting_b(sesskey, "AuthGSSAPIKEX", conf_get_bool(conf, CONF_try_gssapi_kex));
    wprefs(sesskey, "GSSLibs", gsslibkeywords, ngsslibs, conf, CONF_ssh_gsslist);
    write_setting_filename(sesskey, "GSSCustom", conf_get_filename(conf, CONF_ssh_gss_custom));
#endif
    write_setting_b(sesskey, "SshNoShell", conf_get_bool(conf, CONF_ssh_no_shell));
    write_setting_i(sesskey, "SshProt", conf_get_int(conf, CONF_sshprot));
    write_setting_s(sesskey, "LogHost", conf_get_str(conf, CONF_loghost));
    write_setting_b(sesskey, "SSH2DES", conf_get_bool(conf, CONF_ssh2_des_cbc));
    write_setting_filename(sesskey, "PublicKeyFile", conf_get_filename(conf, CONF_keyfile));
    write_setting_filename(sesskey, "DetachedCertificate", conf_get_filename(conf, CONF_detached_cert));
    write_setting_s(sesskey, "RemoteCommand", conf_get_str(conf, CONF_remote_cmd));
    write_setting_b(sesskey, "RFCEnviron", conf_get_bool(conf, CONF_rfc_environ));
    write_setting_b(sesskey, "PassiveTelnet", conf_get_bool(conf, CONF_passive_telnet));
    write_setting_b(sesskey, "BackspaceIsDelete", conf_get_bool(conf, CONF_bksp_is_delete));
    write_setting_b(sesskey, "RXVTHomeEnd", conf_get_bool(conf, CONF_rxvt_homeend));
    write_setting_i(sesskey, "LinuxFunctionKeys", conf_get_int(conf, CONF_funky_type));
    write_setting_i(sesskey, "ShiftedArrowKeys", conf_get_int(conf, CONF_sharrow_type));
    write_setting_b(sesskey, "NoApplicationKeys", conf_get_bool(conf, CONF_no_applic_k));
    write_setting_b(sesskey, "NoApplicationCursors", conf_get_bool(conf, CONF_no_applic_c));
    write_setting_b(sesskey, "NoMouseReporting", conf_get_bool(conf, CONF_no_mouse_rep));
    write_setting_b(sesskey, "NoRemoteResize", conf_get_bool(conf, CONF_no_remote_resize));
    write_setting_b(sesskey, "NoAltScreen", conf_get_bool(conf, CONF_no_alt_screen));
    write_setting_b(sesskey, "NoRemoteWinTitle", conf_get_bool(conf, CONF_no_remote_wintitle));
    write_setting_b(sesskey, "NoRemoteClearScroll", conf_get_bool(conf, CONF_no_remote_clearscroll));
    write_setting_i(sesskey, "RemoteQTitleAction", conf_get_int(conf, CONF_remote_qtitle_action));
    write_setting_b(sesskey, "NoDBackspace", conf_get_bool(conf, CONF_no_dbackspace));
    write_setting_b(sesskey, "NoRemoteCharset", conf_get_bool(conf, CONF_no_remote_charset));
    write_setting_b(sesskey, "ApplicationCursorKeys", conf_get_bool(conf, CONF_app_cursor));
    write_setting_b(sesskey, "ApplicationKeypad", conf_get_bool(conf, CONF_app_keypad));
    write_setting_b(sesskey, "NetHackKeypad", conf_get_bool(conf, CONF_nethack_keypad));
    write_setting_b(sesskey, "AltF4", conf_get_bool(conf, CONF_alt_f4));
    write_setting_b(sesskey, "AltSpace", conf_get_bool(conf, CONF_alt_space));
    write_setting_b(sesskey, "AltOnly", conf_get_bool(conf, CONF_alt_only));
    write_setting_b(sesskey, "ComposeKey", conf_get_bool(conf, CONF_compose_key));
    write_setting_b(sesskey, "CtrlAltKeys", conf_get_bool(conf, CONF_ctrlaltkeys));
#ifdef OSX_META_KEY_CONFIG
    write_setting_b(sesskey, "OSXOptionMeta", conf_get_bool(conf, CONF_osx_option_meta));
    write_setting_b(sesskey, "OSXCommandMeta", conf_get_bool(conf, CONF_osx_command_meta));
#endif
    write_setting_b(sesskey, "TelnetKey", conf_get_bool(conf, CONF_telnet_keyboard));
    write_setting_b(sesskey, "TelnetRet", conf_get_bool(conf, CONF_telnet_newline));
    write_setting_i(sesskey, "LocalEcho", conf_get_int(conf, CONF_localecho));
    write_setting_i(sesskey, "LocalEdit", conf_get_int(conf, CONF_localedit));
    write_setting_s(sesskey, "Answerback", conf_get_str(conf, CONF_answerback));
    write_setting_b(sesskey, "AlwaysOnTop", conf_get_bool(conf, CONF_alwaysontop));
    write_setting_b(sesskey, "FullScreenOnAltEnter", conf_get_bool(conf, CONF_fullscreenonaltenter));
    write_setting_b(sesskey, "HideMousePtr", conf_get_bool(conf, CONF_hide_mouseptr));
    write_setting_b(sesskey, "SunkenEdge", conf_get_bool(conf, CONF_sunken_edge));
    write_setting_i(sesskey, "WindowBorder", conf_get_int(conf, CONF_window_border));
    write_setting_i(sesskey, "CurType", conf_get_int(conf, CONF_cursor_type));
    write_setting_b(sesskey, "BlinkCur", conf_get_bool(conf, CONF_blink_cur));
    write_setting_i(sesskey, "Beep", conf_get_int(conf, CONF_beep));
    write_setting_i(sesskey, "BeepInd", conf_get_int(conf, CONF_beep_ind));
    write_setting_filename(sesskey, "BellWaveFile", conf_get_filename(conf, CONF_bell_wavefile));
    write_setting_b(sesskey, "BellOverload", conf_get_bool(conf, CONF_bellovl));
    write_setting_i(sesskey, "BellOverloadN", conf_get_int(conf, CONF_bellovl_n));
    write_setting_i(sesskey, "BellOverloadT", conf_get_int(conf, CONF_bellovl_t)
#ifdef PUTTY_UNIX_H
                    * 1000
#endif
                    );
    write_setting_i(sesskey, "BellOverloadS", conf_get_int(conf, CONF_bellovl_s)
#ifdef PUTTY_UNIX_H
                    * 1000
#endif
                    );
    write_setting_i(sesskey, "ScrollbackLines", conf_get_int(conf, CONF_savelines));
    write_setting_b(sesskey, "DECOriginMode", conf_get_bool(conf, CONF_dec_om));
    write_setting_b(sesskey, "AutoWrapMode", conf_get_bool(conf, CONF_wrap_mode));
    write_setting_b(sesskey, "LFImpliesCR", conf_get_bool(conf, CONF_lfhascr));
    write_setting_b(sesskey, "CRImpliesLF", conf_get_bool(conf, CONF_crhaslf));
    write_setting_b(sesskey, "DisableArabicShaping", conf_get_bool(conf, CONF_no_arabicshaping));
    write_setting_b(sesskey, "DisableBidi", conf_get_bool(conf, CONF_no_bidi));
    write_setting_b(sesskey, "WinNameAlways", conf_get_bool(conf, CONF_win_name_always));
    write_setting_s(sesskey, "WinTitle", conf_get_str(conf, CONF_wintitle));
    write_setting_i(sesskey, "TermWidth", conf_get_int(conf, CONF_width));
    write_setting_i(sesskey, "TermHeight", conf_get_int(conf, CONF_height));
    write_setting_fontspec(sesskey, "Font", conf_get_fontspec(conf, CONF_font));
    write_setting_i(sesskey, "FontQuality", conf_get_int(conf, CONF_font_quality));
    write_setting_i(sesskey, "FontVTMode", conf_get_int(conf, CONF_vtmode));
    write_setting_b(sesskey, "UseSystemColours", conf_get_bool(conf, CONF_system_colour));
    write_setting_b(sesskey, "TryPalette", conf_get_bool(conf, CONF_try_palette));
    write_setting_b(sesskey, "ANSIColour", conf_get_bool(conf, CONF_ansi_colour));
    write_setting_b(sesskey, "Xterm256Colour", conf_get_bool(conf, CONF_xterm_256_colour));
    write_setting_b(sesskey, "TrueColour", conf_get_bool(conf, CONF_true_colour));
    write_setting_i(sesskey, "BoldAsColour", conf_get_int(conf, CONF_bold_style)-1);

    for (i = 0; i < 22; i++) {
        char buf[20], buf2[30];
        sprintf(buf, "Colour%d", i);
        sprintf(buf2, "%d,%d,%d",
                conf_get_int_int(conf, CONF_colours, i*3+0),
                conf_get_int_int(conf, CONF_colours, i*3+1),
                conf_get_int_int(conf, CONF_colours, i*3+2));
        write_setting_s(sesskey, buf, buf2);
    }
    write_setting_b(sesskey, "RawCNP", conf_get_bool(conf, CONF_rawcnp));
    write_setting_b(sesskey, "UTF8linedraw", conf_get_bool(conf, CONF_utf8linedraw));
    write_setting_b(sesskey, "PasteRTF", conf_get_bool(conf, CONF_rtf_paste));
    write_setting_i(sesskey, "MouseIsXterm", conf_get_int(conf, CONF_mouse_is_xterm));
    write_setting_b(sesskey, "RectSelect", conf_get_bool(conf, CONF_rect_select));
    write_setting_b(sesskey, "PasteControls", conf_get_bool(conf, CONF_paste_controls));
    write_setting_b(sesskey, "MouseOverride", conf_get_bool(conf, CONF_mouse_override));
    for (i = 0; i < 256; i += 32) {
        char buf[20], buf2[256];
        int j;
        sprintf(buf, "Wordness%d", i);
        *buf2 = '\0';
        for (j = i; j < i + 32; j++) {
            sprintf(buf2 + strlen(buf2), "%s%d",
                    (*buf2 ? "," : ""),
                    conf_get_int_int(conf, CONF_wordness, j));
        }
        write_setting_s(sesskey, buf, buf2);
    }
    write_setting_b(sesskey, "MouseAutocopy",
                    conf_get_bool(conf, CONF_mouseautocopy));
    write_clip_setting(sesskey, "MousePaste", conf,
                       CONF_mousepaste, CONF_mousepaste_custom);
    write_clip_setting(sesskey, "CtrlShiftIns", conf,
                       CONF_ctrlshiftins, CONF_ctrlshiftins_custom);
    write_clip_setting(sesskey, "CtrlShiftCV", conf,
                       CONF_ctrlshiftcv, CONF_ctrlshiftcv_custom);
    write_setting_s(sesskey, "LineCodePage", conf_get_str(conf, CONF_line_codepage));
    write_setting_b(sesskey, "CJKAmbigWide", conf_get_bool(conf, CONF_cjk_ambig_wide));
    write_setting_b(sesskey, "UTF8Override", conf_get_bool(conf, CONF_utf8_override));
    write_setting_s(sesskey, "Printer", conf_get_str(conf, CONF_printer));
    write_setting_b(sesskey, "CapsLockCyr", conf_get_bool(conf, CONF_xlat_capslockcyr));
    write_setting_b(sesskey, "ScrollBar", conf_get_bool(conf, CONF_scrollbar));
    write_setting_b(sesskey, "ScrollBarFullScreen", conf_get_bool(conf, CONF_scrollbar_in_fullscreen));
    write_setting_b(sesskey, "ScrollOnKey", conf_get_bool(conf, CONF_scroll_on_key));
    write_setting_b(sesskey, "ScrollOnDisp", conf_get_bool(conf, CONF_scroll_on_disp));
    write_setting_b(sesskey, "EraseToScrollback", conf_get_bool(conf, CONF_erase_to_scrollback));
    write_setting_i(sesskey, "LockSize", conf_get_int(conf, CONF_resize_action));
    write_setting_b(sesskey, "BCE", conf_get_bool(conf, CONF_bce));
    write_setting_b(sesskey, "BlinkText", conf_get_bool(conf, CONF_blinktext));
    write_setting_b(sesskey, "X11Forward", conf_get_bool(conf, CONF_x11_forward));
    write_setting_s(sesskey, "X11Display", conf_get_str(conf, CONF_x11_display));
    write_setting_i(sesskey, "X11AuthType", conf_get_int(conf, CONF_x11_auth));
    write_setting_filename(sesskey, "X11AuthFile", conf_get_filename(conf, CONF_xauthfile));
    write_setting_b(sesskey, "LocalPortAcceptAll", conf_get_bool(conf, CONF_lport_acceptall));
    write_setting_b(sesskey, "RemotePortAcceptAll", conf_get_bool(conf, CONF_rport_acceptall));
    wmap(sesskey, "PortForwardings", conf, CONF_portfwd, true);
    write_setting_i(sesskey, "BugIgnore1", 2-conf_get_int(conf, CONF_sshbug_ignore1));
    write_setting_i(sesskey, "BugPlainPW1", 2-conf_get_int(conf, CONF_sshbug_plainpw1));
    write_setting_i(sesskey, "BugRSA1", 2-conf_get_int(conf, CONF_sshbug_rsa1));
    write_setting_i(sesskey, "BugIgnore2", 2-conf_get_int(conf, CONF_sshbug_ignore2));
    write_setting_i(sesskey, "BugHMAC2", 2-conf_get_int(conf, CONF_sshbug_hmac2));
    write_setting_i(sesskey, "BugDeriveKey2", 2-conf_get_int(conf, CONF_sshbug_derivekey2));
    write_setting_i(sesskey, "BugRSAPad2", 2-conf_get_int(conf, CONF_sshbug_rsapad2));
    write_setting_i(sesskey, "BugPKSessID2", 2-conf_get_int(conf, CONF_sshbug_pksessid2));
    write_setting_i(sesskey, "BugRekey2", 2-conf_get_int(conf, CONF_sshbug_rekey2));
    write_setting_i(sesskey, "BugMaxPkt2", 2-conf_get_int(conf, CONF_sshbug_maxpkt2));
    write_setting_i(sesskey, "BugOldGex2", 2-conf_get_int(conf, CONF_sshbug_oldgex2));
    write_setting_i(sesskey, "BugWinadj", 2-conf_get_int(conf, CONF_sshbug_winadj));
    write_setting_i(sesskey, "BugChanReq", 2-conf_get_int(conf, CONF_sshbug_chanreq));
    write_setting_i(sesskey, "BugDropStart", 2-conf_get_int(conf, CONF_sshbug_dropstart));
    write_setting_b(sesskey, "StampUtmp", conf_get_bool(conf, CONF_stamp_utmp));
    write_setting_b(sesskey, "LoginShell", conf_get_bool(conf, CONF_login_shell));
    write_setting_b(sesskey, "ScrollbarOnLeft", conf_get_bool(conf, CONF_scrollbar_on_left));
    write_setting_fontspec(sesskey, "BoldFont", conf_get_fontspec(conf, CONF_boldfont));
    write_setting_fontspec(sesskey, "WideFont", conf_get_fontspec(conf, CONF_widefont));
    write_setting_fontspec(sesskey, "WideBoldFont", conf_get_fontspec(conf, CONF_wideboldfont));
    write_setting_b(sesskey, "ShadowBold", conf_get_bool(conf, CONF_shadowbold));
    write_setting_i(sesskey, "ShadowBoldOffset", conf_get_int(conf, CONF_shadowboldoffset));
    write_setting_s(sesskey, "SerialLine", conf_get_str(conf, CONF_serline));
    write_setting_i(sesskey, "SerialSpeed", conf_get_int(conf, CONF_serspeed));
    write_setting_i(sesskey, "SerialDataBits", conf_get_int(conf, CONF_serdatabits));
    write_setting_i(sesskey, "SerialStopHalfbits", conf_get_int(conf, CONF_serstopbits));
    write_setting_i(sesskey, "SerialParity", conf_get_int(conf, CONF_serparity));
    write_setting_i(sesskey, "SerialFlowControl", conf_get_int(conf, CONF_serflow));
    write_setting_s(sesskey, "WindowClass", conf_get_str(conf, CONF_winclass));
    write_setting_b(sesskey, "ConnectionSharing", conf_get_bool(conf, CONF_ssh_connection_sharing));
    write_setting_b(sesskey, "ConnectionSharingUpstream", conf_get_bool(conf, CONF_ssh_connection_sharing_upstream));
    write_setting_b(sesskey, "ConnectionSharingDownstream", conf_get_bool(conf, CONF_ssh_connection_sharing_downstream));
    wmap(sesskey, "SSHManualHostKeys", conf, CONF_ssh_manual_hostkeys, false);

    /*
     * SUPDUP settings
     */
    write_setting_s(sesskey, "SUPDUPLocation", conf_get_str(conf, CONF_supdup_location));
    write_setting_i(sesskey, "SUPDUPCharset", conf_get_int(conf, CONF_supdup_ascii_set));
    write_setting_b(sesskey, "SUPDUPMoreProcessing", conf_get_bool(conf, CONF_supdup_more));
    write_setting_b(sesskey, "SUPDUPScrolling", conf_get_bool(conf, CONF_supdup_scroll));
}